

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImStb::STB_TEXTEDIT_GETWIDTH(ImGuiInputTextState *obj,int line_start_idx,int char_idx)

{
  ImGuiContext *pIVar1;
  unsigned_short *puVar2;
  undefined4 in_ESI;
  ImWchar c_00;
  ImFont *in_RDI;
  ImGuiContext *g;
  ImWchar c;
  undefined8 in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe6;
  float local_4;
  
  c_00 = (ImWchar)((uint)in_ESI >> 0x10);
  puVar2 = ImVector<unsigned_short>::operator[]
                     ((ImVector<unsigned_short> *)
                      CONCAT26(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0),
                      (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  pIVar1 = GImGui;
  if (*puVar2 == 10) {
    local_4 = -1.0;
  }
  else {
    local_4 = ImFont::GetCharAdvance(in_RDI,c_00);
    local_4 = local_4 * (pIVar1->FontSize / pIVar1->Font->FontSize);
  }
  return local_4;
}

Assistant:

static float   STB_TEXTEDIT_GETWIDTH(STB_TEXTEDIT_STRING* obj, int line_start_idx, int char_idx)  { ImWchar c = obj->TextW[line_start_idx + char_idx]; if (c == '\n') return STB_TEXTEDIT_GETWIDTH_NEWLINE; ImGuiContext& g = *GImGui; return g.Font->GetCharAdvance(c) * (g.FontSize / g.Font->FontSize); }